

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

size_t jessilib::string_start_action<char32_t,jessilib::KeyContext<true>>
                 (KeyContext<true> *inout_context,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> *inout_read_view)

{
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *this;
  bool bVar1;
  const_reference pvVar2;
  invalid_argument *piVar3;
  size_type sVar4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_RCX;
  __sv_type local_d0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_c0;
  string local_b0;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_90;
  undefined1 local_80 [8];
  u8string string_data;
  size_t end_pos;
  size_t search_start;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *local_20;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *inout_read_view_local;
  KeyContext<true> *inout_context_local;
  
  local_20 = inout_read_view;
  inout_read_view_local = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)inout_context;
  bVar1 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::empty(inout_read_view);
  if (bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"Invalid JSON data; missing ending quote (\") when parsing string");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar2 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::front(local_20);
  if (*pvVar2 == L'\"') {
    std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::remove_prefix(local_20,1);
    std::__cxx11::u8string::u8string((u8string *)&search_start);
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    operator=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
              inout_read_view_local,
              (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
              &search_start);
    std::__cxx11::u8string::~u8string((u8string *)&search_start);
    inout_context_local = (KeyContext<true> *)0x1;
  }
  else {
    end_pos = 1;
    while ((string_data.field_2._8_8_ =
                 std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::find
                           (local_20,L'\"',end_pos), string_data.field_2._8_8_ != 0xffffffffffffffff
           && (pvVar2 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::operator[]
                                  (local_20,string_data.field_2._8_8_ - 1), *pvVar2 == L'\\'))) {
      end_pos = string_data.field_2._8_8_ + 1;
    }
    if (string_data.field_2._8_8_ == -1) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar3,"Invalid JSON data; missing ending quote (\") when parsing string");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_90 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::substr
                         (local_20,0,string_data.field_2._8_8_);
    string_cast<char8_t,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
              ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
               local_80,(jessilib *)&local_90,
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_90._M_str);
    this = local_20;
    sVar4 = std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
            ::size((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                   local_80);
    std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::remove_prefix(this,sVar4 + 1);
    bVar1 = apply_cpp_escape_sequences<char8_t>
                      ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *
                       )local_80);
    if (!bVar1) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_c0 = sv("Invalid JSON data; invalid token or end of string: ",0x33);
      local_d0 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)local_80);
      join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                (&local_b0,(jessilib *)&local_c0,&local_d0,in_RCX);
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_b0);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
    operator=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
              inout_read_view_local,
              (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_80
             );
    inout_context_local = (KeyContext<true> *)0x1;
    std::__cxx11::u8string::~u8string((u8string *)local_80);
  }
  return (size_t)inout_context_local;
}

Assistant:

size_t string_start_action(ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) {
	// Safety check
	if (inout_read_view.empty()) {
		if constexpr (ContextT::use_exceptions) {
			throw std::invalid_argument{ "Invalid JSON data; missing ending quote (\") when parsing string" };
		}

		return std::numeric_limits<size_t>::max();
	}

	// Check if this is just an empty string
	if (inout_read_view.front() == '\"') {
		inout_read_view.remove_prefix(1);
		inout_context.out_object = std::u8string{};
		return 1;
	}

	// Not an empty string; search for the ending quote
	size_t search_start = 1;
	size_t end_pos;
	while ((end_pos = inout_read_view.find('\"', search_start)) != std::string_view::npos) {
		// Quote found; check if it's escaped
		if (inout_read_view[end_pos - 1] != '\\') {
			// Unescaped quote; must be end of string
			break;
		}

		search_start = end_pos + 1;
	}

	// Early out if we didn't find the terminating quote
	if (end_pos == std::string_view::npos) {
		if constexpr (ContextT::use_exceptions) {
			throw std::invalid_argument{ "Invalid JSON data; missing ending quote (\") when parsing string" };
		}

		return std::numeric_limits<size_t>::max();
	}

	// jessilib::object only current accepts UTF-8 text; copy the necessary data instead of sequencing in-place
	// additionally, even when it does accept other encodings, it'll be storing them as UTF-8 as well, though
	// sequencing in-place and recoding the result would still likely be slightly quicker than recoding the input
	std::u8string string_data = jessilib::string_cast<char8_t>(inout_read_view.substr(0, end_pos));
	inout_read_view.remove_prefix(string_data.size() + 1); // Advance the read view to after the terminating quote
	if (!jessilib::apply_cpp_escape_sequences(string_data)) {
		if constexpr (ContextT::use_exceptions) {
			using namespace std::literals;
			throw std::invalid_argument {
				jessilib::join_mbstring(u8"Invalid JSON data; invalid token or end of string: "sv,
					std::u8string_view{ string_data })
			};
		}

		return std::numeric_limits<size_t>::max();
	}

	inout_context.out_object = std::move(string_data);
	return 1;
}